

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O3

int gost_mgm128_aad(mgm128_context *ctx,uchar *aad,size_t len)

{
  block128_f p_Var1;
  mul128_f p_Var2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  
  if ((ctx->len).u[1] != 0) {
    ERR_GOST_error(0xaa,0x84,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0xfb);
    return -2;
  }
  uVar11 = (ctx->len).u[0];
  p_Var1 = ctx->block;
  p_Var2 = ctx->mul_gf;
  pvVar3 = ctx->key;
  uVar10 = ctx->blocklen;
  uVar13 = (ulong)(int)uVar10;
  if (uVar11 == 0) {
    (ctx->nonce).c[0] = (ctx->nonce).c[0] | 0x80;
    (*p_Var1)((uchar *)ctx,(uchar *)&ctx->Zi,pvVar3);
  }
  if ((CARRY8(uVar11,len)) || ((ulong)(1L << ((char)uVar10 * '\x04' - 3U & 0x3f)) < uVar11 + len)) {
    ERR_GOST_error(0xaa,0x8d,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x108);
    return -1;
  }
  (ctx->len).u[0] = uVar11 + len;
  uVar12 = ctx->ares;
  if (uVar12 == 0) {
LAB_00116145:
    if (uVar13 <= len) {
      do {
        (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
        (*p_Var2)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)aad);
        uVar12 = (ctx->mul).d[1];
        uVar4 = (ctx->mul).d[2];
        uVar5 = (ctx->mul).d[3];
        uVar6 = (ctx->sum).d[1];
        uVar7 = (ctx->sum).d[2];
        uVar8 = (ctx->sum).d[3];
        (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
        (ctx->sum).d[1] = uVar6 ^ uVar12;
        (ctx->sum).d[2] = uVar7 ^ uVar4;
        (ctx->sum).d[3] = uVar8 ^ uVar5;
        inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar10 / 2));
        aad = (uchar *)((long)aad + uVar13);
        len = len - uVar13;
      } while (uVar13 <= len);
    }
    uVar10 = 0;
    if (len != 0) {
      uVar11 = 0;
      do {
        (ctx->ACi).c[uVar11] = *(uchar *)((long)aad + uVar11);
        uVar11 = uVar11 + 1;
      } while (len != uVar11);
      uVar10 = (uint)len;
    }
    ctx->ares = uVar10;
  }
  else {
    sVar14 = len;
    if (len != 0) {
      do {
        uVar9 = *(uint64_t *)aad;
        aad = (uchar *)((long)aad + 1);
        (ctx->ACi).c[uVar12] = (uchar)uVar9;
        len = sVar14 - 1;
        uVar12 = (uVar12 + 1) % uVar10;
        if (uVar12 == 0) break;
        bVar15 = sVar14 != 1;
        sVar14 = len;
      } while (bVar15);
      if (uVar12 == 0) {
        (*p_Var1)((uchar *)&ctx->Zi,(uchar *)&ctx->Hi,pvVar3);
        (*p_Var2)((uint64_t *)&ctx->mul,(uint64_t *)&ctx->Hi,(uint64_t *)&ctx->ACi);
        uVar12 = (ctx->mul).d[1];
        uVar4 = (ctx->mul).d[2];
        uVar5 = (ctx->mul).d[3];
        uVar6 = (ctx->sum).d[1];
        uVar7 = (ctx->sum).d[2];
        uVar8 = (ctx->sum).d[3];
        (ctx->sum).d[0] = (ctx->sum).d[0] ^ (ctx->mul).d[0];
        (ctx->sum).d[1] = uVar6 ^ uVar12;
        (ctx->sum).d[2] = uVar7 ^ uVar4;
        (ctx->sum).d[3] = uVar8 ^ uVar5;
        inc_counter((uchar *)(ctx->Zi).u,(long)((int)uVar10 / 2));
        goto LAB_00116145;
      }
    }
    ctx->ares = uVar12;
  }
  return 0;
}

Assistant:

int gost_mgm128_aad(mgm128_context *ctx, const unsigned char *aad,
                      size_t len)
{
    size_t i;
    unsigned int n;
    uint64_t alen = ctx->len.u[0];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->len.u[1]) {
        GOSTerr(GOST_F_GOST_MGM128_AAD,
                GOST_R_BAD_ORDER);
        return -2;
    }

    if (alen == 0) {
        ctx->nonce.c[0] |= 0x80;
        (*block) (ctx->nonce.c, ctx->Zi.c, key);    // Z_1 = E_K(1 || nonce)
    }

    alen += len;
    if (alen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||      // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && alen < len)) {
            GOSTerr(GOST_F_GOST_MGM128_AAD,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[0] = alen;

    n = ctx->ares;
    if (n) {
        /* Finalize partial_data */
        while (n && len) {
            ctx->ACi.c[n] = *(aad++);
            --len;
            n = (n + 1) % bl;
        }
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
              (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                              // Z_{i+1} = incr_l(Z_i)
        } else {
            ctx->ares = n;
            return 0;
        }
    }
    while (len >= bl) {
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                       // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, (uint64_t *)aad);             // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,        // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                                  // Z_{i+1} = incr_l(Z_i)
        aad += bl;
        len -= bl;
    }
    if (len) {
        n = (unsigned int)len;
        for (i = 0; i < len; ++i)
            ctx->ACi.c[i] = aad[i];
    }

    ctx->ares = n;
    return 0;
}